

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::RuntimeCharSet<char16_t>::Get_helper(RuntimeCharSet<char16_t> *this,uint k)

{
  uint uVar1;
  CharSetLeaf *leaf;
  uint i;
  CharSetInner *inner;
  CharSetNode *pCStack_28;
  int level;
  CharSetNode *curr;
  uint k_local;
  RuntimeCharSet<char16_t> *this_local;
  
  pCStack_28 = this->root;
  inner._4_4_ = 2;
  while( true ) {
    if ((int)inner._4_4_ < 1) {
      if (pCStack_28 == (CharSetNode *)&CharSetFull::Instance) {
        this_local._7_1_ = true;
      }
      else {
        uVar1 = CharSetNode::leafIdx(k);
        this_local._7_1_ = CharBitvec::Get((CharBitvec *)(pCStack_28 + 1),uVar1);
      }
      return this_local._7_1_;
    }
    if (pCStack_28 == (CharSetNode *)&CharSetFull::Instance) break;
    uVar1 = CharSetNode::innerIdx(inner._4_4_,k);
    if (pCStack_28[(ulong)uVar1 + 1]._vptr_CharSetNode == (_func_int **)0x0) {
      return false;
    }
    pCStack_28 = (CharSetNode *)pCStack_28[(ulong)uVar1 + 1]._vptr_CharSetNode;
    inner._4_4_ = inner._4_4_ - 1;
  }
  return true;
}

Assistant:

bool RuntimeCharSet<char16>::Get_helper(uint k) const
    {
        CharSetNode* curr = root;
        for (int level = CharSetNode::levels - 1; level > 0; level--)
        {
            if (curr == CharSetFull::TheFullNode)
                return true;
            CharSetInner* inner = (CharSetInner*)curr;
            uint i = CharSetNode::innerIdx(level, k);
            if (inner->children[i] == 0)
                return false;
            else
                curr = inner->children[i];
        }
        if (curr == CharSetFull::TheFullNode)
            return true;
        CharSetLeaf* leaf = (CharSetLeaf*)curr;
        return leaf->vec.Get(CharSetNode::leafIdx(k));
    }